

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNativeOperators.cpp
# Opt level: O1

void * Js::JavascriptNativeOperators::Op_SwitchStringLookUp
                 (JavascriptString *str,
                 BranchDictionaryWrapper<Js::JavascriptString_*> *branchTargets,uintptr_t funcStart,
                 uintptr_t funcEnd)

{
  long lVar1;
  code *pcVar2;
  bool bVar3;
  hash_t hashCode;
  uint uVar4;
  undefined4 *puVar5;
  JavascriptString *pJVar6;
  DictionaryStats *this;
  uint uVar7;
  JavascriptString *local_50;
  JavascriptString *str_local;
  uintptr_t local_40;
  uintptr_t local_38;
  
  lVar1 = *(long *)branchTargets;
  str_local = *(JavascriptString **)(branchTargets + 0x38);
  uVar4 = 0;
  local_50 = str;
  local_40 = funcEnd;
  local_38 = funcStart;
  if (lVar1 != 0) {
    hashCode = JsUtil::
               BaseDictionary<Js::JavascriptString*,void*,Js::BranchDictionaryWrapper<Js::JavascriptString*>::DictAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,Js::BranchDictionaryWrapper<Js::JavascriptString*>::SimpleDictionaryEntryWithFixUp,JsUtil::NoResizeLock>
               ::GetHashCodeWithKey<Js::JavascriptString*>(&local_50);
    uVar4 = JsUtil::
            BaseDictionary<Js::JavascriptString_*,_void_*,_Js::BranchDictionaryWrapper<Js::JavascriptString_*>::DictAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_Js::BranchDictionaryWrapper<Js::JavascriptString_*>::SimpleDictionaryEntryWithFixUp,_JsUtil::NoResizeLock>
            ::GetBucket(hashCode,*(int *)(branchTargets + 0x1c),*(int *)(branchTargets + 0x2c));
    uVar7 = *(uint *)(lVar1 + (ulong)uVar4 * 4);
    uVar4 = 0;
    if (-1 < (int)uVar7) {
      lVar1 = *(long *)(branchTargets + 8);
      uVar4 = 0;
      do {
        bVar3 = JavascriptString::Equals
                          (*(JavascriptString **)(lVar1 + 0x10 + (ulong)uVar7 * 0x18),local_50);
        if (bVar3) {
          this = *(DictionaryStats **)(branchTargets + 0x30);
          goto LAB_0056d3e8;
        }
        uVar4 = uVar4 + 1;
        uVar7 = *(uint *)(lVar1 + (ulong)uVar7 * 0x18 + 8);
      } while (-1 < (int)uVar7);
    }
  }
  this = *(DictionaryStats **)(branchTargets + 0x30);
  uVar7 = 0xffffffff;
LAB_0056d3e8:
  if (this != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this,uVar4);
  }
  pJVar6 = str_local;
  if (-1 < (int)uVar7) {
    pJVar6 = *(JavascriptString **)(*(long *)(branchTargets + 8) + (ulong)uVar7 * 0x18);
  }
  if (local_40 - local_38 < (long)pJVar6 - local_38) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JavascriptNativeOperators.cpp"
                                ,0x12,"((utarget - funcStart) <= (funcEnd - funcStart))",
                                "Switch string dictionary jump target outside of function");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return pJVar6;
}

Assistant:

void * JavascriptNativeOperators::Op_SwitchStringLookUp(JavascriptString* str, Js::BranchDictionaryWrapper<JavascriptString*>* branchTargets, uintptr_t funcStart, uintptr_t funcEnd)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(Op_SwitchStringLookUp);
        void* defaultTarget = branchTargets->defaultTarget;
        Js::BranchDictionaryWrapper<JavascriptString*>::BranchDictionary& stringDictionary = branchTargets->dictionary;
        void* target = stringDictionary.Lookup(str, defaultTarget);
        uintptr_t utarget = (uintptr_t)target;

        AssertOrFailFastMsg((utarget - funcStart) <= (funcEnd - funcStart), "Switch string dictionary jump target outside of function");
        return target;
        JIT_HELPER_END(Op_SwitchStringLookUp);
    }